

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O1

wchar_t * uriParseOwnHostUserInfoNzW
                    (UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                    UriMemoryManager *memory)

{
  UriUriW *pUVar1;
  UriBool UVar2;
  wchar_t wVar3;
  UriIp4 *octetOutput;
  wchar_t *pwVar4;
  
switchD_001b638b_caseD_21:
  if (first < afterLast) {
    switch(*first) {
    case L'!':
    case L'$':
    case L'%':
    case L'&':
    case L'\'':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L',':
    case L'-':
    case L'.':
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
    case L';':
    case L'=':
    case L'A':
    case L'B':
    case L'C':
    case L'D':
    case L'E':
    case L'F':
    case L'G':
    case L'H':
    case L'I':
    case L'J':
    case L'K':
    case L'L':
    case L'M':
    case L'N':
    case L'O':
    case L'P':
    case L'Q':
    case L'R':
    case L'S':
    case L'T':
    case L'U':
    case L'V':
    case L'W':
    case L'X':
    case L'Y':
    case L'Z':
    case L'_':
    case L'a':
    case L'b':
    case L'c':
    case L'd':
    case L'e':
    case L'f':
    case L'g':
    case L'h':
    case L'i':
    case L'j':
    case L'k':
    case L'l':
    case L'm':
    case L'n':
    case L'o':
    case L'p':
    case L'q':
    case L'r':
    case L's':
    case L't':
    case L'u':
    case L'v':
    case L'w':
    case L'x':
    case L'y':
    case L'z':
    case L'~':
      goto switchD_001b6353_caseD_21;
    default:
      uriFreeUriMembersMmW(state->uri,memory);
      state->errorPos = first;
      goto LAB_001b63b7;
    case L':':
      pUVar1 = state->uri;
      (pUVar1->hostText).afterLast = first;
      (pUVar1->portText).first = first + 1;
      pwVar4 = uriParseOwnPortUserInfoW(state,first + 1,afterLast,memory);
      return pwVar4;
    case L'@':
      pUVar1 = state->uri;
      (pUVar1->userInfo).afterLast = first;
      (pUVar1->hostText).first = first + 1;
      pwVar4 = uriParseOwnHostW(state,first + 1,afterLast,memory);
      return pwVar4;
    }
  }
  uriFreeUriMembersMmW(state->uri,memory);
  state->errorPos = afterLast;
LAB_001b63b7:
  state->errorCode = L'\x01';
  goto LAB_001b643d;
switchD_001b6353_caseD_21:
  first = uriParsePctSubUnresW(state,first,afterLast,memory);
  if (first == (wchar_t *)0x0) goto LAB_001b643d;
  if (afterLast <= first) {
    pUVar1 = state->uri;
    (pUVar1->hostText).first = (pUVar1->userInfo).first;
    (pUVar1->userInfo).first = (wchar_t *)0x0;
    (pUVar1->hostText).afterLast = first;
    octetOutput = (UriIp4 *)(*memory->malloc)(memory,4);
    pUVar1 = state->uri;
    (pUVar1->hostData).ip4 = octetOutput;
    if (octetOutput != (UriIp4 *)0x0) {
      wVar3 = uriParseIpFourAddressW
                        ((uchar *)octetOutput,(pUVar1->hostText).first,(pUVar1->hostText).afterLast)
      ;
      if (wVar3 != L'\0') {
        (*memory->free)(memory,(state->uri->hostData).ip4);
        (state->uri->hostData).ip4 = (UriIp4 *)0x0;
      }
      if (octetOutput != (UriIp4 *)0x0) {
        return afterLast;
      }
    }
    goto LAB_001b6423;
  }
  switch(*first) {
  case L'!':
  case L'$':
  case L'%':
  case L'&':
  case L'\'':
  case L'(':
  case L')':
  case L'*':
  case L'+':
  case L',':
  case L'-':
  case L'.':
  case L'0':
  case L'1':
  case L'2':
  case L'3':
  case L'4':
  case L'5':
  case L'6':
  case L'7':
  case L'8':
  case L'9':
  case L':':
  case L';':
  case L'=':
  case L'@':
  case L'A':
  case L'B':
  case L'C':
  case L'D':
  case L'E':
  case L'F':
  case L'G':
  case L'H':
  case L'I':
  case L'J':
  case L'K':
  case L'L':
  case L'M':
  case L'N':
  case L'O':
  case L'P':
  case L'Q':
  case L'R':
  case L'S':
  case L'T':
  case L'U':
  case L'V':
  case L'W':
  case L'X':
  case L'Y':
  case L'Z':
  case L'_':
  case L'a':
  case L'b':
  case L'c':
  case L'd':
  case L'e':
  case L'f':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'n':
  case L'o':
  case L'p':
  case L'q':
  case L'r':
  case L's':
  case L't':
  case L'u':
  case L'v':
  case L'w':
  case L'x':
  case L'y':
  case L'z':
  case L'~':
    goto switchD_001b638b_caseD_21;
  default:
    UVar2 = uriOnExitOwnHostUserInfoW(state,first,memory);
    if (UVar2 == 0) {
LAB_001b6423:
      uriFreeUriMembersMmW(state->uri,memory);
      state->errorPos = (wchar_t *)0x0;
      state->errorCode = L'\x03';
LAB_001b643d:
      first = (wchar_t *)0x0;
    }
    return first;
  }
}

Assistant:

static const URI_CHAR * URI_FUNC(ParseOwnHostUserInfoNz)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		const URI_CHAR * afterLast, UriMemoryManager * memory) {
	if (first >= afterLast) {
		URI_FUNC(StopSyntax)(state, afterLast, memory);
		return NULL;
	}

	switch (*first) {
	case _UT('!'):
	case _UT('$'):
	case _UT('%'):
	case _UT('&'):
	case _UT('('):
	case _UT(')'):
	case _UT('-'):
	case _UT('*'):
	case _UT(','):
	case _UT('.'):
	case _UT(';'):
	case _UT('\''):
	case _UT('_'):
	case _UT('~'):
	case _UT('+'):
	case _UT('='):
	case URI_SET_DIGIT:
	case URI_SET_ALPHA:
		{
			const URI_CHAR * const afterPctSubUnres
					= URI_FUNC(ParsePctSubUnres)(state, first, afterLast, memory);
			if (afterPctSubUnres == NULL) {
				return NULL;
			}
			return URI_FUNC(ParseOwnHostUserInfo)(state, afterPctSubUnres, afterLast, memory);
		}

	case _UT(':'):
		state->uri->hostText.afterLast = first; /* HOST END */
		state->uri->portText.first = first + 1; /* PORT BEGIN */
		return URI_FUNC(ParseOwnPortUserInfo)(state, first + 1, afterLast, memory);

	case _UT('@'):
		state->uri->userInfo.afterLast = first; /* USERINFO END */
		state->uri->hostText.first = first + 1; /* HOST BEGIN */
		return URI_FUNC(ParseOwnHost)(state, first + 1, afterLast, memory);

	default:
		URI_FUNC(StopSyntax)(state, first, memory);
		return NULL;
	}
}